

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall
semver::detail::parse<signed_char,signed_char,signed_char>
          (detail *this,string_view str,version<signed_char,_signed_char,_signed_char> *out)

{
  pointer ptVar1;
  undefined1 auVar2 [12];
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  undefined4 uVar6;
  from_chars_result fVar7;
  token_stream token_stream;
  token local_78;
  undefined1 local_68 [8];
  pointer ptStack_60;
  iterator local_58;
  token *ptStack_50;
  lexer local_40;
  
  local_40.text_._M_str = (char *)str._M_len;
  local_58._M_current = (token *)0x0;
  ptStack_50 = (token *)0x0;
  local_68 = (undefined1  [8])0x0;
  ptStack_60 = (pointer)0x0;
  local_40.current_pos_ = 0;
  pcVar4 = local_40.text_._M_str;
  local_40.text_._M_len = (size_t)this;
  if (this != (detail *)0x0) {
    do {
      fVar7 = lexer::scan_token(&local_40,(token_stream *)local_68);
      auVar2 = fVar7.super_from_chars_result._0_12_;
      if (fVar7.super_from_chars_result.ec != 0) goto LAB_0016319e;
    } while (local_40.current_pos_ < local_40.text_._M_len);
    local_78.lexeme = local_40.text_._M_str + (long)(undefined1 *)local_40.text_._M_len;
    local_78.type = eol;
    local_78.value.
    super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
    super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
         = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
           0x0;
    pcVar4 = local_78.lexeme;
    if (local_58._M_current != ptStack_50) {
      lVar3 = (ulong)(uint5)local_78._3_5_ << 0x18;
      (local_58._M_current)->type = (char)lVar3;
      (local_58._M_current)->value = (value_t)(short)((ulong)lVar3 >> 8);
      *(int5 *)&(local_58._M_current)->field_0x3 = (int5)((ulong)lVar3 >> 0x18);
      (local_58._M_current)->lexeme = local_78.lexeme;
      local_58._M_current = local_58._M_current + 1;
      goto LAB_00163185;
    }
  }
  local_78.lexeme = pcVar4;
  local_78.value.
  super__Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Move_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Copy_ctor_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>.
  super__Variant_storage_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
       = (_Variant_base<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
         (_Move_assign_alias<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>)
         0x0;
  local_78.type = eol;
  std::vector<semver::detail::token,std::allocator<semver::detail::token>>::
  _M_realloc_insert<semver::detail::token_const&>
            ((vector<semver::detail::token,std::allocator<semver::detail::token>> *)&ptStack_60,
             local_58,&local_78);
LAB_00163185:
  local_40.text_._M_len = (size_t)local_68;
  fVar7 = version_parser::parse<signed_char,signed_char,signed_char>
                    ((version_parser *)&local_40,
                     (version<signed_char,_signed_char,_signed_char> *)str._M_str);
  auVar2 = fVar7.super_from_chars_result._0_12_;
  if (fVar7.super_from_chars_result.ec == 0) {
    sVar5 = (long)local_68 + 1;
    ptVar1 = ptStack_60 + (long)local_68;
    pcVar4 = ptStack_60[(long)local_68].lexeme;
    uVar6 = 0x16;
    local_68 = (undefined1  [8])sVar5;
    if (ptVar1->type == eol) {
      uVar6 = 0;
    }
  }
  else {
LAB_0016319e:
    pcVar4 = auVar2._0_8_;
    uVar6 = auVar2._8_4_;
  }
  if (ptStack_60 != (pointer)0x0) {
    operator_delete(ptStack_60,(long)ptStack_50 - (long)ptStack_60);
  }
  fVar7.super_from_chars_result.ec = uVar6;
  fVar7.super_from_chars_result.ptr = pcVar4;
  fVar7.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar7.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, version<I1, I2, I3>& out) {
  token_stream token_stream;
  from_chars_result result = lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  result = version_parser{ token_stream }.parse(out);
  if (!result) {
    return result;
  }

  if (!token_stream.consume(token_type::eol)) {
    return failure(token_stream.previous().lexeme);
  }

  return success(token_stream.previous().lexeme);
}